

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_metric(REF_GRID ref_grid,char *filename)

{
  int version;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  REF_STATUS RVar5;
  FILE *__s;
  void *pvVar6;
  undefined8 *puVar7;
  size_t sVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  REF_MPI pRVar12;
  REF_STATUS ref_private_macro_code_rxs;
  long lVar13;
  REF_LONG ref_private_status_reis_bi;
  REF_NODE pRVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  REF_INT keyword_code;
  REF_BOOL met_format;
  REF_BOOL solb_format;
  REF_INT local;
  REF_INT code;
  uint local_b4;
  int local_a4;
  void *local_a0;
  REF_NODE local_98;
  ulong local_90;
  undefined4 local_88;
  REF_BOOL local_84;
  REF_BOOL local_80;
  uint local_7c;
  REF_MPI local_78;
  ulong local_70;
  ulong local_68;
  uint local_60;
  int local_5c;
  long local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  undefined4 local_34;
  
  pRVar14 = ref_grid->node;
  local_80 = 0;
  local_84 = 0;
  uVar1 = ref_node_synchronize_globals(pRVar14);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xbac,
           "ref_gather_metric",(ulong)uVar1,"sync");
    return uVar1;
  }
  if (ref_grid->mpi->id == 0) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xbb2,"ref_gather_metric","unable to open file");
      return 2;
    }
    sVar8 = strlen(filename);
    if ((5 < sVar8) && (iVar3 = strcmp(filename + (sVar8 - 5),".solb"), iVar3 == 0)) {
      local_80 = 1;
    }
    if ((4 < sVar8) && (iVar3 = strcmp(filename + (sVar8 - 4),".met"), iVar3 == 0)) {
      local_84 = 1;
    }
  }
  else {
    __s = (FILE *)0x0;
  }
  uVar1 = ref_mpi_all_or(ref_grid->mpi,&local_80);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xbba,
           "ref_gather_metric",(ulong)uVar1,"bcast");
    return uVar1;
  }
  uVar1 = ref_mpi_all_or(ref_grid->mpi,&local_84);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xbbb,
           "ref_gather_metric",(ulong)uVar1,"bcast");
    return uVar1;
  }
  uVar1 = 0;
  if (local_80 == 0) {
    if (local_84 == 0) {
      local_b4 = ref_gather_node_metric(pRVar14,(FILE *)__s);
      if (local_b4 == 0) goto LAB_00135448;
      uVar9 = 0xbc2;
      uVar1 = local_b4;
    }
    else {
      local_b4 = ref_gather_node_bamg_met(ref_grid,(FILE *)__s);
      if (local_b4 == 0) goto LAB_00135448;
      uVar9 = 0xbc0;
      uVar1 = local_b4;
    }
  }
  else {
    pRVar12 = ref_grid->mpi;
    pRVar14 = ref_grid->node;
    uVar2 = ref_node_synchronize_globals(pRVar14);
    local_b4 = uVar2;
    if (uVar2 == 0) {
      bVar17 = ref_grid->twod == 0;
      lVar13 = 0x18;
      if (bVar17) {
        lVar13 = 0x30;
      }
      local_7c = bVar17 | 2;
      local_a4 = 2;
      iVar3 = ref_grid->meshb_version;
      if ((ref_grid->meshb_version < 2) && (iVar3 = local_a4, 10000000 < pRVar14->old_n_global)) {
        iVar3 = (200000000 < pRVar14->old_n_global) + 3;
      }
      local_a4 = iVar3;
      iVar3 = local_a4;
      pvVar6 = (void *)(ulong)((uint)(2 < local_a4) * 4 + 8);
      if (pRVar12->id == 0) {
        local_34 = 1;
        local_a0 = pvVar6;
        local_98 = pRVar14;
        sVar8 = fwrite(&local_34,4,1,__s);
        if (sVar8 == 1) {
          sVar8 = fwrite(&local_a4,4,1,__s);
          if (sVar8 == 1) {
            local_90 = ftell(__s);
            local_88 = 3;
            sVar8 = fwrite(&local_88,4,1,__s);
            if (sVar8 == 1) {
              local_70 = ((ulong)local_a0 & 0xffffffff) + local_90 + 4;
              local_b4 = ref_export_meshb_next_position((FILE *)__s,local_a4,local_70);
              if (local_b4 == 0) {
                sVar8 = fwrite(&local_7c,4,1,__s);
                if (sVar8 == 1) {
                  uVar15 = ftell(__s);
                  uVar10 = local_70;
                  local_b4 = uVar2;
                  if (local_70 != uVar15) {
                    local_90 = uVar15;
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x5a6,"ref_gather_node_metric_solb","dim inconsistent",local_70,uVar15);
                    local_b4 = 1;
                    uVar15 = local_90;
                  }
                  pvVar6 = local_a0;
                  pRVar14 = local_98;
                  if (uVar10 == uVar15) goto LAB_001354ba;
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5a5,"ref_gather_node_metric_solb","dim",1,sVar8);
                  local_b4 = 1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x5a4,"ref_gather_node_metric_solb",(ulong)local_b4,"next p");
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5a3,"ref_gather_node_metric_solb","dim code",1,sVar8);
              local_b4 = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x5a0,"ref_gather_node_metric_solb","version",1,sVar8);
            local_b4 = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x59f,"ref_gather_node_metric_solb","code",1,sVar8);
          local_b4 = 1;
        }
      }
      else {
        local_70 = 0;
LAB_001354ba:
        if (pRVar12->id == 0) {
          lVar16 = pRVar14->old_n_global;
          local_a0 = pvVar6;
          local_98 = pRVar14;
          local_78 = pRVar12;
          local_90 = ftell(__s);
          local_88 = 0x3e;
          sVar8 = fwrite(&local_88,4,1,__s);
          version = local_a4;
          if (sVar8 == 1) {
            uVar10 = local_90 + (ulong)((int)local_a0 + (uint)(3 < iVar3) * 4) + lVar13 * lVar16 +
                     0xc;
            uVar2 = ref_export_meshb_next_position((FILE *)__s,local_a4,uVar10);
            if (uVar2 == 0) {
              RVar5 = ref_gather_meshb_glob((FILE *)__s,version,local_98->old_n_global);
              if (RVar5 == 0) {
                local_88 = 1;
                sVar8 = fwrite(&local_88,4,1,__s);
                if (sVar8 == 1) {
                  local_88 = 3;
                  local_70 = uVar10;
                  sVar8 = fwrite(&local_88,4,1,__s);
                  pRVar12 = local_78;
                  pRVar14 = local_98;
                  if (sVar8 == 1) goto LAB_001354c6;
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5b6,"ref_gather_node_metric_solb","metric solution",1,sVar8);
                  local_b4 = 1;
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5b4,"ref_gather_node_metric_solb","n solutions",1,sVar8);
                  local_b4 = 1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x5b2,"ref_gather_node_metric_solb",1,"nnode");
                local_b4 = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x5b0,"ref_gather_node_metric_solb",(ulong)uVar2,"next p");
              local_b4 = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x5af,"ref_gather_node_metric_solb","vertex version code",1,sVar8);
            local_b4 = 1;
          }
        }
        else {
LAB_001354c6:
          lVar13 = pRVar14->old_n_global;
          uVar4 = (int)(lVar13 / (long)pRVar12->n) + 1;
          uVar2 = 0x7fffffff;
          if (0 < pRVar12->reduce_byte_limit) {
            uVar2 = (uint)pRVar12->reduce_byte_limit / 0x38;
          }
          if ((int)uVar4 < (int)uVar2) {
            uVar2 = uVar4;
          }
          if ((int)uVar4 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x5bd,"ref_gather_node_metric_solb","malloc local_xyzm of REF_DBL negative");
            local_b4 = 1;
          }
          else {
            uVar4 = uVar2 * 7;
            local_98 = pRVar14;
            local_78 = pRVar12;
            local_50 = (ulong)uVar2;
            local_a0 = malloc((ulong)uVar4 << 3);
            if (local_a0 == (void *)0x0) {
              pcVar11 = "malloc local_xyzm of REF_DBL NULL";
              uVar9 = 0x5bd;
            }
            else {
              pvVar6 = malloc((ulong)uVar4 << 3);
              if (pvVar6 != (void *)0x0) {
                if (0 < lVar13) {
                  local_48 = local_50 & 0xffffffff;
                  uVar10 = 1;
                  if (1 < (int)uVar4) {
                    uVar10 = (ulong)uVar4;
                  }
                  local_60 = local_7c;
                  local_40 = uVar10 << 3;
                  lVar16 = 0;
                  do {
                    uVar10 = lVar13 - lVar16;
                    if ((long)local_48 < lVar13 - lVar16) {
                      uVar10 = local_50;
                    }
                    uVar15 = uVar10 & 0xffffffff;
                    if ((int)local_50 != 0) {
                      memset(local_a0,0,local_40);
                    }
                    local_68 = uVar15;
                    local_58 = lVar16;
                    if (0 < (int)uVar10) {
                      local_90 = uVar15 * 0x38;
                      uVar10 = 0;
                      do {
                        uVar2 = ref_node_local(local_98,lVar16,&local_5c);
                        if ((uVar2 != 0) && (uVar2 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0x5ce,"ref_gather_node_metric_solb",(ulong)uVar2,
                                 "node local failed");
                          local_b4 = uVar2;
                        }
                        if (uVar2 == 5) {
LAB_001356c2:
                          puVar7 = (undefined8 *)((uVar10 & 0x7fffffff8) + (long)local_a0);
                          puVar7[4] = 0;
                          puVar7[5] = 0;
                          puVar7[2] = 0;
                          puVar7[3] = 0;
                          *puVar7 = 0;
                          puVar7[1] = 0;
                          puVar7[6] = 0;
                        }
                        else {
                          if (uVar2 != 0) goto LAB_00135290;
                          if (local_78->id != local_98->part[local_5c]) goto LAB_001356c2;
                          uVar2 = ref_node_metric_get(local_98,local_5c,
                                                      (REF_DBL *)((long)local_a0 + uVar10));
                          if (uVar2 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5d1,"ref_gather_node_metric_solb",(ulong)uVar2,"get");
                            local_b4 = uVar2;
                            goto LAB_00135290;
                          }
                          *(undefined8 *)((long)local_a0 + uVar10 + 0x30) = 0x3ff0000000000000;
                        }
                        uVar10 = uVar10 + 0x38;
                        lVar16 = lVar16 + 1;
                      } while (local_90 != uVar10);
                    }
                    pRVar12 = local_78;
                    uVar2 = ref_mpi_sum(local_78,local_a0,pvVar6,(int)local_68 * 7,3);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x5d8,"ref_gather_node_metric_solb",(ulong)uVar2,"sum");
                      local_b4 = uVar2;
                      goto LAB_00135290;
                    }
                    iVar3 = (int)local_68;
                    if ((0 < iVar3) && (pRVar12->id == 0)) {
                      local_90 = (local_68 & 0xffffffff) * 0x38;
                      uVar10 = 0;
                      lVar13 = local_58;
                      do {
                        dVar18 = *(double *)((long)pvVar6 + uVar10 + 0x30) + -1.0;
                        if (dVar18 <= -dVar18) {
                          dVar18 = -dVar18;
                        }
                        if (0.1 < dVar18) {
                          printf("error gather node %ld %f\n",lVar13);
                        }
                        sVar8 = fwrite((void *)((long)pvVar6 + uVar10),8,1,__s);
                        if (local_60 == 3) {
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5e1,"ref_gather_node_metric_solb","m11",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 8),8,1,__s);
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5e2,"ref_gather_node_metric_solb","m12",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 0x18),8,1,__s);
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5e4,"ref_gather_node_metric_solb","m22",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 0x10),8,1,__s);
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5e5,"ref_gather_node_metric_solb","m13",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 0x20),8,1,__s);
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5e6,"ref_gather_node_metric_solb","m23",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 0x28),8,1,__s);
                          if (sVar8 != 1) {
                            uVar9 = 0x5e7;
                            pcVar11 = "m33";
                            goto LAB_00135b70;
                          }
                        }
                        else {
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5e9,"ref_gather_node_metric_solb","m11",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 8),8,1,__s);
                          if (sVar8 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,0x5ea,"ref_gather_node_metric_solb","m12",1,sVar8);
                            local_b4 = 1;
                            goto LAB_00135290;
                          }
                          sVar8 = fwrite((void *)((long)pvVar6 + uVar10 + 0x18),8,1,__s);
                          if (sVar8 != 1) {
                            uVar9 = 0x5eb;
                            pcVar11 = "m22";
LAB_00135b70:
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                   ,uVar9,"ref_gather_node_metric_solb",pcVar11,1,sVar8);
                            local_b4 = 1;
                          }
                        }
                        if (sVar8 != 1) goto LAB_00135290;
                        lVar13 = lVar13 + 1;
                        uVar10 = uVar10 + 0x38;
                        iVar3 = (int)local_68;
                      } while (local_90 != uVar10);
                    }
                    lVar16 = local_58 + iVar3;
                    lVar13 = local_98->old_n_global;
                  } while (lVar16 < lVar13);
                }
                pRVar12 = local_78;
                free(pvVar6);
                free(local_a0);
                if ((pRVar12->id == 0) && (uVar10 = ftell(__s), local_70 != uVar10)) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x5f4,"ref_gather_node_metric_solb","solb metric record len inconsistent",
                         local_70,uVar10);
                  local_b4 = 1;
                }
                else if (pRVar12->id == 0) {
                  local_88 = 0x36;
                  sVar8 = fwrite(&local_88,4,1,__s);
                  if (sVar8 == 1) {
                    local_b4 = ref_export_meshb_next_position((FILE *)__s,local_a4,0);
                    if (local_b4 == 0) goto LAB_001360de;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x5fa,"ref_gather_node_metric_solb",(ulong)local_b4,"next p");
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x5f8,"ref_gather_node_metric_solb","end kw",1,sVar8);
                    local_b4 = 1;
                  }
                }
                else {
LAB_001360de:
                  local_b4 = 0;
                }
                goto LAB_00135290;
              }
              pcVar11 = "malloc xyzm of REF_DBL NULL";
              uVar9 = 0x5be;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar9,"ref_gather_node_metric_solb",pcVar11);
            local_b4 = 2;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x586,"ref_gather_node_metric_solb",(ulong)uVar2,"sync");
    }
LAB_00135290:
    if (local_b4 == 0) goto LAB_00135448;
    uVar9 = 0xbbe;
    uVar1 = local_b4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
         "ref_gather_metric",(ulong)uVar1,"nodes");
  local_b4 = uVar1;
LAB_00135448:
  if (local_b4 == 0) {
    uVar1 = 0;
    if (ref_grid->mpi->id == 0) {
      fclose(__s);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_gather_metric(REF_GRID ref_grid, const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL met_format = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
    if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".met") == 0)
      met_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &solb_format), "bcast");
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &met_format), "bcast");

  if (solb_format) {
    RSS(ref_gather_node_metric_solb(ref_grid, file), "nodes");
  } else if (met_format) {
    RSS(ref_gather_node_bamg_met(ref_grid, file), "nodes");
  } else {
    RSS(ref_gather_node_metric(ref_node, file), "nodes");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}